

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O2

char * Diligent::GetShaderCodeVariableClassString(SHADER_CODE_VARIABLE_CLASS Class)

{
  char *pcVar1;
  string msg;
  string local_28;
  
  if (Class < SHADER_CODE_VARIABLE_CLASS_COUNT) {
    pcVar1 = &DAT_002ee6d0 + *(int *)(&DAT_002ee6d0 + (ulong)Class * 4);
  }
  else {
    FormatString<char[35]>(&local_28,(char (*) [35])"Unknown/unsupported variable class");
    DebugAssertionFailed
              (local_28._M_dataplus._M_p,"GetShaderCodeVariableClassString",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x693);
    std::__cxx11::string::~string((string *)&local_28);
    pcVar1 = "UNKNOWN";
  }
  return pcVar1;
}

Assistant:

const char* GetShaderCodeVariableClassString(SHADER_CODE_VARIABLE_CLASS Class)
{
    static_assert(SHADER_CODE_VARIABLE_CLASS_COUNT == 6, "Did you add a new variable class? Please update the switch below.");
    switch (Class)
    {
        // clang-format off
        case SHADER_CODE_VARIABLE_CLASS_UNKNOWN:        return "unknown";
        case SHADER_CODE_VARIABLE_CLASS_SCALAR:         return "scalar";
        case SHADER_CODE_VARIABLE_CLASS_VECTOR:         return "vector";
        case SHADER_CODE_VARIABLE_CLASS_MATRIX_ROWS:    return "matrix-rows";
        case SHADER_CODE_VARIABLE_CLASS_MATRIX_COLUMNS: return "matrix-columns";
        case SHADER_CODE_VARIABLE_CLASS_STRUCT:         return "struct";
        // clang-format on
        default: UNEXPECTED("Unknown/unsupported variable class"); return "UNKNOWN";
    }
}